

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

size_t __thiscall Parsing::File::getLength(File *this,string *s)

{
  char cVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  
  lVar2 = std::__cxx11::string::find_last_of((char *)s,0x108231,0xffffffffffffffff);
  for (sVar4 = 0;
      (cVar1 = (s->_M_dataplus)._M_p[sVar4 + lVar2 + 1U], sVar3 = lVar2 + 1U, cVar1 != '\0' &&
      (sVar3 = sVar4, cVar1 != '.')); sVar4 = sVar4 + 1) {
  }
  return sVar3;
}

Assistant:

size_t File::getLength(std::string &s) const
    {
        size_t p = s.find_last_of("/") + 1;

        for (size_t n = p; s[n]; n++)
            if (s[n] == '.')
                return n - p;
        return p;
    }